

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

bool checkStatement(bool statement,char *msg,char *file,int line)

{
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  byte in_DIL;
  bool doContinue_1;
  bool doContinue;
  undefined6 in_stack_00000020;
  undefined1 in_stack_00000027;
  char *in_stack_00000028;
  undefined1 failed;
  undefined1 local_1;
  
  if ((in_DIL & 1) == 0) {
    if (QTest::expectFailMode == 0) {
      QTestResult::addFailure(in_RSI,in_RDX,in_ECX);
      local_1 = false;
    }
    else {
      if ((QTest::blacklistCurrentTest & 1) == 0) {
        QTestLog::addXFail(in_stack_00000028,
                           (char *)CONCAT17(in_stack_00000027,CONCAT16(statement,in_stack_00000020))
                           ,msg._4_4_);
      }
      else {
        QTestLog::addBXFail(in_stack_00000028,
                            (char *)CONCAT17(in_stack_00000027,CONCAT16(statement,in_stack_00000020)
                                            ),msg._4_4_);
      }
      local_1 = QTest::expectFailMode == 2;
      clearExpectFail();
    }
  }
  else if (QTest::expectFailMode == 0) {
    local_1 = true;
  }
  else {
    if ((QTest::blacklistCurrentTest & 1) == 0) {
      QTestLog::addXPass(in_stack_00000028,
                         (char *)CONCAT17(in_stack_00000027,CONCAT16(statement,in_stack_00000020)),
                         msg._4_4_);
      failed = (undefined1)((ulong)in_RDX >> 0x30);
    }
    else {
      QTestLog::addBXPass(in_stack_00000028,
                          (char *)CONCAT17(in_stack_00000027,CONCAT16(statement,in_stack_00000020)),
                          msg._4_4_);
      failed = (undefined1)((ulong)in_RDX >> 0x30);
    }
    QTest::setFailed((bool)failed);
    local_1 = QTest::expectFailMode == 2;
    clearExpectFail();
  }
  return local_1;
}

Assistant:

static bool checkStatement(bool statement, const char *msg, const char *file, int line)
{
    if (statement) {
        if (QTest::expectFailMode) {
            if (QTest::blacklistCurrentTest)
                QTestLog::addBXPass(msg, file, line);
            else
                QTestLog::addXPass(msg, file, line);

            QTest::setFailed(true);
            // Should B?XPass always (a) continue or (b) abort, regardless of mode ?
            bool doContinue = (QTest::expectFailMode == QTest::Continue);
            clearExpectFail();
            return doContinue;
        }
        return true;
    }

    if (QTest::expectFailMode) {
        if (QTest::blacklistCurrentTest)
            QTestLog::addBXFail(QTest::expectFailComment, file, line);
        else
            QTestLog::addXFail(QTest::expectFailComment, file, line);
        bool doContinue = (QTest::expectFailMode == QTest::Continue);
        clearExpectFail();
        return doContinue;
    }

    QTestResult::addFailure(msg, file, line);
    return false;
}